

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall
Js::ParseableFunctionInfo::Copy(ParseableFunctionInfo *this,ParseableFunctionInfo *other)

{
  byte bVar1;
  ushort uVar2;
  ScriptFunctionType *pSVar3;
  Type TVar4;
  void *pvVar5;
  RecyclerWeakReference<Js::JavascriptString> *weakRef;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  
  FunctionProxy::Copy(&this->super_FunctionProxy,&other->super_FunctionProxy);
  other->flags = this->flags;
  pSVar3 = (this->crossSiteDeferredFunctionType).ptr;
  Memory::Recycler::WBSetBit((char *)&other->crossSiteDeferredFunctionType);
  (other->crossSiteDeferredFunctionType).ptr = pSVar3;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&other->crossSiteDeferredFunctionType);
  pSVar3 = (this->crossSiteUndeferredFunctionType).ptr;
  Memory::Recycler::WBSetBit((char *)&other->crossSiteUndeferredFunctionType);
  (other->crossSiteUndeferredFunctionType).ptr = pSVar3;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&other->crossSiteUndeferredFunctionType);
  uVar9 = *(ushort *)&(this->super_FunctionProxy).field_0x45 & 4;
  uVar2 = *(ushort *)&(other->super_FunctionProxy).field_0x45;
  *(ushort *)&(other->super_FunctionProxy).field_0x45 = uVar2 & 0xfffb | uVar9;
  uVar10 = *(ushort *)&(this->super_FunctionProxy).field_0x45 & 8;
  *(ushort *)&(other->super_FunctionProxy).field_0x45 = uVar2 & 0xfff3 | uVar9 | uVar10;
  uVar11 = *(ushort *)&(this->super_FunctionProxy).field_0x45 & 0x100;
  *(ushort *)&(other->super_FunctionProxy).field_0x45 = uVar2 & 0xfef3 | uVar9 | uVar10 | uVar11;
  uVar12 = *(ushort *)&(this->super_FunctionProxy).field_0x45 & 0x1000;
  *(ushort *)&(other->super_FunctionProxy).field_0x45 =
       uVar2 & 0xeef3 | uVar9 | uVar10 | uVar11 | uVar12;
  uVar13 = *(ushort *)&(this->super_FunctionProxy).field_0x45 & 0x2000;
  *(ushort *)&(other->super_FunctionProxy).field_0x45 =
       uVar2 & 0xcef3 | uVar9 | uVar10 | uVar11 | uVar12 | uVar13;
  uVar14 = *(ushort *)&(this->super_FunctionProxy).field_0x45 & 0x4000;
  *(ushort *)&(other->super_FunctionProxy).field_0x45 =
       uVar2 & 0x8ef3 | uVar9 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14;
  *(ushort *)&(other->super_FunctionProxy).field_0x45 =
       uVar2 & 0xef3 | uVar9 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14 |
       *(ushort *)&(this->super_FunctionProxy).field_0x45 & 0x8000;
  bVar6 = (this->super_FunctionProxy).field_0x47 & 1;
  bVar1 = (other->super_FunctionProxy).field_0x47;
  (other->super_FunctionProxy).field_0x47 = bVar1 & 0xfe | bVar6;
  bVar7 = (this->super_FunctionProxy).field_0x47 & 2;
  (other->super_FunctionProxy).field_0x47 = bVar1 & 0xfc | bVar6 | bVar7;
  bVar8 = (this->super_FunctionProxy).field_0x47 & 4;
  (other->super_FunctionProxy).field_0x47 = bVar1 & 0xf8 | bVar6 | bVar7 | bVar8;
  (other->super_FunctionProxy).field_0x47 =
       bVar1 & 0xf0 | bVar6 | bVar7 | bVar8 | (this->super_FunctionProxy).field_0x47 & 8;
  other->m_inParamCount = this->m_inParamCount;
  other->m_grfscr = this->m_grfscr;
  pvVar5 = FunctionProxy::GetAuxPtr(&this->super_FunctionProxy,ScopeInfo);
  FunctionProxy::SetAuxPtr(&other->super_FunctionProxy,ScopeInfo,pvVar5);
  pvVar5 = FunctionProxy::GetAuxPtr(&this->super_FunctionProxy,DeferredStubs);
  FunctionProxy::SetAuxPtr(&other->super_FunctionProxy,DeferredStubs,pvVar5);
  pvVar5 = FunctionProxy::GetAuxPtr(&this->super_FunctionProxy,PrintOffsets);
  FunctionProxy::SetAuxPtr(&other->super_FunctionProxy,PrintOffsets,pvVar5);
  (other->super_FunctionProxy).field_0x47 =
       (other->super_FunctionProxy).field_0x47 & 0x7f |
       (this->super_FunctionProxy).field_0x47 & 0x80;
  other->deferredParseNextFunctionId = this->deferredParseNextFunctionId;
  other->scopeObjectSize = this->scopeObjectSize;
  other->scopeSlotArraySize = this->scopeSlotArraySize;
  other->paramScopeSlotArraySize = this->paramScopeSlotArraySize;
  weakRef = (RecyclerWeakReference<Js::JavascriptString> *)
            FunctionProxy::GetAuxPtr(&this->super_FunctionProxy,CachedSourceString);
  SetCachedSourceStringWeakRef(other,weakRef);
  uVar9 = *(ushort *)&(this->super_FunctionProxy).field_0x45 & 0x200;
  uVar2 = *(ushort *)&(other->super_FunctionProxy).field_0x45;
  *(ushort *)&(other->super_FunctionProxy).field_0x45 = uVar2 & 0xfdff | uVar9;
  *(ushort *)&(other->super_FunctionProxy).field_0x45 =
       uVar2 & 63999 | uVar9 | *(ushort *)&(this->super_FunctionProxy).field_0x45 & 0x400;
  pvVar5 = FunctionProxy::GetAuxPtr(&this->super_FunctionProxy,PropertyIdsForScopeSlotArray);
  if (pvVar5 != (void *)0x0) {
    TVar4 = this->paramScopeSlotArraySize;
    other->scopeSlotArraySize = this->scopeSlotArraySize;
    other->paramScopeSlotArraySize = TVar4;
    FunctionProxy::SetAuxPtr(&other->super_FunctionProxy,PropertyIdsForScopeSlotArray,pvVar5);
  }
  other->m_sourceIndex = this->m_sourceIndex;
  other->m_cchStartOffset = this->m_cchStartOffset;
  other->m_cchLength = this->m_cchLength;
  other->m_lineNumber = this->m_lineNumber;
  other->m_columnNumber = this->m_columnNumber;
  other->m_cbStartOffset = this->m_cbStartOffset;
  other->m_cbLength = this->m_cbLength;
  CopyNestedArray(this,other);
  return;
}

Assistant:

void ParseableFunctionInfo::Copy(ParseableFunctionInfo * other)
    {
        __super::Copy(other);

#define CopyDeferParseField(field) other->field = this->field;
        CopyDeferParseField(flags);
        CopyDeferParseField(crossSiteDeferredFunctionType);
        CopyDeferParseField(crossSiteUndeferredFunctionType);
        CopyDeferParseField(m_isDeclaration);
        CopyDeferParseField(m_isAccessor);
        CopyDeferParseField(m_isStrictMode);
        CopyDeferParseField(m_isGlobalFunc);
        CopyDeferParseField(m_doBackendArgumentsOptimization);
        CopyDeferParseField(m_doScopeObjectCreation);
        CopyDeferParseField(m_usesArgumentsObject);
        CopyDeferParseField(m_isEval);
        CopyDeferParseField(m_isDynamicFunction);
        CopyDeferParseField(m_hasImplicitArgIns);
        CopyDeferParseField(m_dontInline);
        CopyDeferParseField(m_inParamCount);
        CopyDeferParseField(m_grfscr);
        other->SetScopeInfo(this->GetScopeInfo());
        other->SetDeferredStubs(this->GetDeferredStubs());
        other->SetPrintOffsets(this->GetPrintOffsets());
        CopyDeferParseField(m_utf8SourceHasBeenSet);
#if DBG
        CopyDeferParseField(deferredParseNextFunctionId);
        CopyDeferParseField(scopeObjectSize);
#endif
        CopyDeferParseField(scopeSlotArraySize);
        CopyDeferParseField(paramScopeSlotArraySize);
        other->SetCachedSourceStringWeakRef(this->GetCachedSourceStringWeakRef());
        CopyDeferParseField(m_isAsmjsMode);
        CopyDeferParseField(m_isAsmJsFunction);

        PropertyId * propertyIds = this->GetPropertyIdsForScopeSlotArray();
        if (propertyIds != nullptr)
        {
            other->SetPropertyIdsForScopeSlotArray(propertyIds, this->scopeSlotArraySize, this->paramScopeSlotArraySize);
        }

        CopyDeferParseField(m_sourceIndex);
        CopyDeferParseField(m_cchStartOffset);
        CopyDeferParseField(m_cchLength);
        CopyDeferParseField(m_lineNumber);
        CopyDeferParseField(m_columnNumber);
        CopyDeferParseField(m_cbStartOffset);
        CopyDeferParseField(m_cbLength);

        this->CopyNestedArray(other);
#undef CopyDeferParseField
   }